

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.hpp
# Opt level: O0

uint __thiscall diy::io::NumPy::read_header(NumPy *this)

{
  uint uVar1;
  size_t offset_00;
  runtime_error *this_00;
  BOV *in_RDI;
  size_t offset;
  bool fortran;
  Shape shape;
  bool *in_stack_000002a0;
  Shape *in_stack_000002a8;
  NumPy *in_stack_000002b0;
  vector<int,_std::allocator<int>_> *this_01;
  byte local_21;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffe8;
  BOV *in_stack_fffffffffffffff0;
  
  this_01 = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffe0;
  Catch::clara::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)0x18cae2);
  offset_00 = parse_npy_header(in_stack_000002b0,in_stack_000002a8,in_stack_000002a0);
  if ((local_21 & 1) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"diy::io::NumPy cannot read data in fortran order");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  BOV::set_offset(in_RDI,offset_00);
  BOV::set_shape<std::vector<int,std::allocator<int>>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  uVar1 = *(uint *)&in_RDI[1].f_;
  Catch::clara::std::vector<int,_std::allocator<int>_>::~vector(this_01);
  return uVar1;
}

Assistant:

unsigned          read_header()
      {
        BOV::Shape  shape;
        bool        fortran;
        size_t      offset = parse_npy_header(shape, fortran);
        if (fortran)
            throw std::runtime_error("diy::io::NumPy cannot read data in fortran order");
        BOV::set_offset(offset);
        BOV::set_shape(shape);
        return word_size_;
      }